

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

void duckdb::Timestamp::Convert
               (timestamp_ns_t input,date_t *out_date,dtime_t *out_time,int32_t *out_nanos)

{
  bool bVar1;
  long lVar2;
  ConversionException *this;
  long lVar3;
  int64_t days_nanos;
  long local_50;
  string local_48;
  
  lVar2 = ((long)input.super_timestamp_t.value - ((long)input.super_timestamp_t.value >> 0x3f)) /
          1000 + ((long)input.super_timestamp_t.value >> 0x3f);
  lVar3 = lVar2 >> 0x3f;
  lVar3 = (lVar2 - lVar3) / 86400000000 + lVar3;
  out_date->days = (int32_t)lVar3;
  bVar1 = TryMultiplyOperator::Operation<long,long,long>(lVar3,86400000000000,&local_50);
  if (bVar1) {
    lVar3 = ((long)input.super_timestamp_t.value - local_50) / 1000;
    out_time->micros = lVar3;
    *out_nanos = (int)((long)input.super_timestamp_t.value - local_50) + (int)lVar3 * -1000;
    return;
  }
  this = (ConversionException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"Date out of range in timestamp_ns conversion","");
  ConversionException::ConversionException(this,&local_48);
  __cxa_throw(this,&ConversionException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Timestamp::Convert(timestamp_ns_t input, date_t &out_date, dtime_t &out_time, int32_t &out_nanos) {
	timestamp_t ms(TemporalRound(input.value, Interval::NANOS_PER_MICRO));
	out_date = Timestamp::GetDate(ms);
	int64_t days_nanos;
	if (!TryMultiplyOperator::Operation<int64_t, int64_t, int64_t>(out_date.days, Interval::NANOS_PER_DAY,
	                                                               days_nanos)) {
		throw ConversionException("Date out of range in timestamp_ns conversion");
	}

	out_time = dtime_t((input.value - days_nanos) / Interval::NANOS_PER_MICRO);
	out_nanos = UnsafeNumericCast<int32_t>((input.value - days_nanos) % Interval::NANOS_PER_MICRO);
}